

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_tensor_layout.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateTensorTypeWithDimValuesNV
          (ValidationState_t *_,Instruction *inst,ExpectedNumValues expected,bool is_view)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  Op OVar4;
  DiagnosticStream *pDVar5;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this;
  size_type sVar6;
  string local_680;
  char *local_660;
  DiagnosticStream local_658;
  Instruction *local_480;
  Instruction *val;
  uint val_id;
  uint32_t i;
  DiagnosticStream local_468;
  Instruction *local_290;
  uint64_t expected_num_values;
  uint64_t dim_value;
  uint dim_id;
  int dim_index;
  Instruction *result_type;
  size_type num_values;
  char *local_248;
  DiagnosticStream local_240;
  Instruction *local_68;
  Instruction *tensor;
  uint local_58;
  uint tensor_id;
  uint result_type_id;
  spv_result_t error_1;
  undefined1 local_48 [4];
  spv_result_t error;
  string type_str;
  bool is_view_local;
  ExpectedNumValues expected_local;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  type_str.field_2._M_local_buf[0xb] = is_view;
  type_str.field_2._12_4_ = expected;
  std::__cxx11::string::string((string *)local_48);
  if ((type_str.field_2._M_local_buf[0xb] & 1U) == 0) {
    tensor_id = ValidateTensorLayoutResultTypeNV(_,inst);
    __local._4_4_ = tensor_id;
    if (tensor_id != SPV_SUCCESS) goto LAB_00241c36;
    std::__cxx11::string::operator=((string *)local_48,"TensorLayout");
  }
  else {
    error_1 = ValidateTensorViewResultTypeNV(_,inst);
    __local._4_4_ = error_1;
    if (error_1 != SPV_SUCCESS) goto LAB_00241c36;
    std::__cxx11::string::operator=((string *)local_48,"TensorView");
  }
  local_58 = Instruction::GetOperandAs<unsigned_int>(inst,0);
  tensor._4_4_ = Instruction::GetOperandAs<unsigned_int>(inst,2);
  local_68 = ValidationState_t::FindDef(_,tensor._4_4_);
  uVar1 = local_58;
  if ((local_68 == (Instruction *)0x0) || (uVar3 = Instruction::type_id(local_68), uVar1 != uVar3))
  {
    ValidationState_t::diag(&local_240,_,SPV_ERROR_INVALID_ID,inst);
    OVar4 = Instruction::opcode(inst);
    local_248 = spvOpcodeString(OVar4);
    pDVar5 = DiagnosticStream::operator<<(&local_240,&local_248);
    pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [19])0x57c0db);
    ValidationState_t::getIdName_abi_cxx11_((string *)&num_values,_,local_58);
    pDVar5 = DiagnosticStream::operator<<
                       (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &num_values);
    pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [17])" does not match ");
    pDVar5 = DiagnosticStream::operator<<
                       (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_48);
    pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [7])0x5804d1);
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    std::__cxx11::string::~string((string *)&num_values);
    DiagnosticStream::~DiagnosticStream(&local_240);
  }
  else {
    this = Instruction::operands(inst);
    sVar6 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(this);
    result_type = (Instruction *)(sVar6 - 3);
    _dim_id = ValidationState_t::FindDef(_,local_58);
    dim_value._4_4_ = 1;
    dim_value._0_4_ = Instruction::GetOperandAs<unsigned_int>(_dim_id,1);
    bVar2 = ValidationState_t::EvalConstantValUint64(_,(uint)dim_value,&expected_num_values);
    if (bVar2) {
      local_290 = (Instruction *)0x0;
      switch(type_str.field_2._12_4_) {
      case 0:
        local_290 = (Instruction *)expected_num_values;
        break;
      case 1:
        local_290 = (Instruction *)(expected_num_values << 1);
        break;
      case 2:
        local_290 = (Instruction *)0x1;
        break;
      case 3:
        local_290 = (Instruction *)0x4;
      }
      if (result_type != local_290) {
        ValidationState_t::diag(&local_468,_,SPV_ERROR_INVALID_ID,inst);
        OVar4 = Instruction::opcode(inst);
        _val_id = spvOpcodeString(OVar4);
        pDVar5 = DiagnosticStream::operator<<(&local_468,(char **)&val_id);
        pDVar5 = DiagnosticStream::operator<<
                           (pDVar5,(char (*) [32])" unexpected number of operands.");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
        DiagnosticStream::~DiagnosticStream(&local_468);
        goto LAB_00241c36;
      }
    }
    for (val._4_4_ = 0; (Instruction *)(ulong)val._4_4_ < result_type; val._4_4_ = val._4_4_ + 1) {
      val._0_4_ = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)(val._4_4_ + 3));
      local_480 = ValidationState_t::FindDef(_,(uint)val);
      if (local_480 == (Instruction *)0x0) {
LAB_00241b55:
        ValidationState_t::diag(&local_658,_,SPV_ERROR_INVALID_ID,inst);
        OVar4 = Instruction::opcode(inst);
        local_660 = spvOpcodeString(OVar4);
        pDVar5 = DiagnosticStream::operator<<(&local_658,&local_660);
        pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [15])0x57b3f8);
        ValidationState_t::getIdName_abi_cxx11_(&local_680,_,(uint)val);
        pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_680);
        pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [26])" is not a 32-bit integer.");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
        std::__cxx11::string::~string((string *)&local_680);
        DiagnosticStream::~DiagnosticStream(&local_658);
        goto LAB_00241c36;
      }
      uVar3 = Instruction::type_id(local_480);
      bVar2 = ValidationState_t::IsIntScalarType(_,uVar3);
      if (!bVar2) goto LAB_00241b55;
      uVar3 = Instruction::type_id(local_480);
      uVar3 = ValidationState_t::GetBitWidth(_,uVar3);
      if (uVar3 != 0x20) goto LAB_00241b55;
    }
    __local._4_4_ = SPV_SUCCESS;
  }
LAB_00241c36:
  result_type_id = 1;
  std::__cxx11::string::~string((string *)local_48);
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateTensorTypeWithDimValuesNV(ValidationState_t& _,
                                               const Instruction* inst,
                                               ExpectedNumValues expected,
                                               bool is_view) {
  std::string type_str;
  if (is_view) {
    if (auto error = ValidateTensorViewResultTypeNV(_, inst)) return error;
    type_str = "TensorView";
  } else {
    if (auto error = ValidateTensorLayoutResultTypeNV(_, inst)) return error;
    type_str = "TensorLayout";
  }

  const auto result_type_id = inst->GetOperandAs<uint32_t>(0);
  const auto tensor_id = inst->GetOperandAs<uint32_t>(2);
  const auto tensor = _.FindDef(tensor_id);
  if (!tensor || result_type_id != tensor->type_id()) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << spvOpcodeString(inst->opcode()) << " Result Type <id> "
           << _.getIdName(result_type_id) << " does not match " << type_str
           << " type.";
  }

  const auto num_values = inst->operands().size() - 3;

  const auto result_type = _.FindDef(result_type_id);
  const auto dim_index = 1;
  const auto dim_id = result_type->GetOperandAs<uint32_t>(dim_index);
  uint64_t dim_value;
  if (_.EvalConstantValUint64(dim_id, &dim_value)) {
    uint64_t expected_num_values = 0;
    switch (expected) {
      case DIM:
        expected_num_values = dim_value;
        break;
      case DIMx2:
        expected_num_values = dim_value * 2;
        break;
      case ONE:
        expected_num_values = 1;
        break;
      case FOUR:
        expected_num_values = 4;
        break;
    }

    if (num_values != expected_num_values) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << spvOpcodeString(inst->opcode())
             << " unexpected number of operands.";
    }
  }

  for (uint32_t i = 0; i < num_values; ++i) {
    const auto val_id = inst->GetOperandAs<uint32_t>(i + 3);
    const auto val = _.FindDef(val_id);
    if (!val || !_.IsIntScalarType(val->type_id()) ||
        _.GetBitWidth(val->type_id()) != 32) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << spvOpcodeString(inst->opcode()) << " operand <id> "
             << _.getIdName(val_id) << " is not a 32-bit integer.";
    }
  }

  return SPV_SUCCESS;
}